

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O1

bool __thiscall SymbolTable::symbolExists(SymbolTable *this,Identifier *symbol,int file,int section)

{
  char *pcVar1;
  bool bVar2;
  iterator iVar3;
  int section_00;
  int file_00;
  SymbolKey key;
  SymbolKey local_48;
  
  bVar2 = isValidSymbolName(symbol);
  if (bVar2) {
    pcVar1 = (symbol->_name)._M_dataplus._M_p;
    section_00 = -1;
    file_00 = -1;
    if ((*pcVar1 == '@') && (section_00 = -1, file_00 = file, pcVar1[1] == '@')) {
      section_00 = section;
      file_00 = -1;
    }
    SymbolKey::SymbolKey(&local_48,symbol,file_00,section_00);
    iVar3 = std::
            _Rb_tree<SymbolKey,_std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>,_std::_Select1st<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
            ::find((_Rb_tree<SymbolKey,_std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>,_std::_Select1st<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
                    *)this,&local_48);
    bVar2 = (_Rb_tree_header *)iVar3._M_node != &(this->symbols)._M_t._M_impl.super__Rb_tree_header;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.name._M_dataplus._M_p != &local_48.name.field_2) {
      operator_delete(local_48.name._M_dataplus._M_p,local_48.name.field_2._M_allocated_capacity + 1
                     );
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SymbolTable::symbolExists(const Identifier& symbol, int file, int section)
{
	if (!isValidSymbolName(symbol))
		return false;

	setFileSectionValues(symbol,file,section);

	SymbolKey key = { symbol, file, section };
	auto it = symbols.find(key);
	return it != symbols.end();
}